

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O1

void shade_rect(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  uint uVar1;
  Fl_Color FVar2;
  int iVar3;
  uchar *puVar4;
  size_t sVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar6;
  uint uVar7;
  int iVar9;
  uint uVar10;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar8;
  
  puVar4 = fl_gray_ramp();
  sVar5 = strlen(c);
  iVar3 = (int)sVar5;
  iVar6 = iVar3 + -1;
  iVar9 = (iVar3 - (iVar6 >> 0x1f)) + -1 >> 1;
  if (h < w * 2) {
    iVar11 = (h < iVar3) + 1;
    if (2 < iVar3) {
      uVar10 = (w + x) - 2;
      uVar1 = w + -1 + x;
      uVar13 = h + y;
      pcVar14 = c + iVar6;
      iVar3 = 0;
      uVar8 = (ulong)(uint)y;
      pcVar12 = c;
      do {
        FVar2 = fl_color_average((uint)puVar4[*pcVar12],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,x + 1,uVar8,(ulong)uVar10);
        FVar2 = fl_color_average((uint)puVar4[(long)*pcVar12 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,CONCAT44(in_register_0000003c,x),uVar8);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar1,(ulong)uVar7);
        FVar2 = fl_color_average((uint)puVar4[*pcVar14],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,x + 1,(ulong)uVar13,(ulong)uVar10);
        FVar2 = fl_color_average((uint)puVar4[(long)*pcVar14 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,CONCAT44(in_register_0000003c,x),(ulong)uVar13);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar1,(ulong)uVar13);
        iVar3 = iVar3 + iVar11;
        uVar13 = uVar13 - 1;
        pcVar14 = pcVar14 + -1;
        pcVar12 = pcVar12 + 1;
      } while (iVar3 < iVar9);
    }
    iVar11 = iVar9 / iVar11;
    FVar2 = fl_color_average((uint)puVar4[c[iVar9]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    uVar10 = iVar11 + y;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(x + 1),(ulong)uVar10,(ulong)(w - 2),
               (ulong)(iVar11 * -2 + h + 1));
    FVar2 = fl_color_average((uint)puVar4[(long)c[iVar9] + -2],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    uVar1 = (h + y) - iVar11;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
              (fl_graphics_driver,x,(ulong)uVar10,(ulong)uVar1);
    uVar13 = (w + x) - 1;
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9];
  }
  else {
    iVar11 = (w < iVar3) + 1;
    if (2 < iVar3) {
      uVar1 = h + -1 + y;
      uVar10 = (w + x) - 2;
      pcVar14 = c + iVar6;
      iVar3 = 0;
      uVar8 = (ulong)(uint)x;
      pcVar12 = c;
      do {
        FVar2 = fl_color_average((uint)puVar4[*pcVar12],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,uVar8,y + 1,(ulong)uVar1);
        FVar2 = fl_color_average((uint)puVar4[(long)*pcVar12 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        uVar13 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar13;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar13,CONCAT44(in_register_00000034,y));
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar13,(ulong)(uint)(h + y));
        FVar2 = fl_color_average((uint)puVar4[*pcVar14],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)(uVar10 + 1),y + 1,(ulong)uVar1);
        FVar2 = fl_color_average((uint)puVar4[(long)*pcVar14 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar2);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar10,CONCAT44(in_register_00000034,y));
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar10,(ulong)(uint)(h + y));
        iVar3 = iVar3 + iVar11;
        uVar10 = uVar10 - 1;
        pcVar14 = pcVar14 + -1;
        pcVar12 = pcVar12 + 1;
      } while (iVar3 < iVar9);
    }
    iVar11 = iVar9 / iVar11;
    FVar2 = fl_color_average((uint)puVar4[c[iVar9]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    uVar13 = iVar11 + x;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar13,(ulong)(y + 1),(ulong)(uint)(w + iVar11 * -2),
               (ulong)(h - 1));
    FVar2 = fl_color_average((uint)puVar4[(long)c[iVar9] + -2],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    uVar1 = (w + x) - iVar11;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)uVar13,y,(ulong)uVar1);
    uVar10 = h + y;
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6];
  }
  (*UNRECOVERED_JUMPTABLE)(fl_graphics_driver,(ulong)uVar13,(ulong)uVar10,(ulong)uVar1);
  return;
}

Assistant:

static void shade_rect(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i, j;
  int	clen = (int) strlen(c) - 1;
  int	chalf = clen / 2;
  int	cstep = 1;

  if (h < (w * 2)) {
    // Horizontal shading...
    if (clen >= h) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the top line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_xyline(x + 1, y + i, x + w - 2);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x, y + i + 1);
      fl_point(x + w - 1, y + i + 1);

      // Draw the bottom line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_xyline(x + 1, y + h - i, x + w - 2);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x, y + h - i);
      fl_point(x + w - 1, y + h - i);
    }

    // Draw the interior and sides...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + 1, y + i, w - 2, h - 2 * i + 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_yxline(x, y + i, y + h - i);
    fl_yxline(x + w - 1, y + i, y + h - i);
  } else {
    // Vertical shading...
    if (clen >= w) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the left line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_yxline(x + i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x + i + 1, y);
      fl_point(x + i + 1, y + h);

      // Draw the right line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_yxline(x + w - 1 - i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x + w - 2 - i, y);
      fl_point(x + w - 2 - i, y + h);
    }

    // Draw the interior, top, and bottom...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + i, y + 1, w - 2 * i, h - 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_xyline(x + i, y, x + w - i);
    fl_xyline(x + i, y + h, x + w - i);
  }
}